

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVSTInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  DecodeStatus DVar4;
  uint uVar5;
  MCInst *Inst_00;
  ulong Address_00;
  void *Decoder_00;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint Rm;
  uint Rn;
  uint wb;
  DecodeStatus S;
  void *in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  MCInst *in_stack_ffffffffffffffa8;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  
  local_2c[0] = MCDisassembler_Success;
  local_14 = in_ESI;
  local_10 = in_RDI;
  fieldFromInstruction_4(in_ESI,0xc,4);
  fieldFromInstruction_4(local_14,0x16,1);
  fieldFromInstruction_4(local_14,0x10,4);
  fieldFromInstruction_4(local_14,0x10,4);
  fieldFromInstruction_4(local_14,4,2);
  uVar2 = fieldFromInstruction_4(local_14,0,4);
  uVar3 = MCInst_getOpcode(local_10);
  switch(uVar3) {
  case 0x768:
  case 0x769:
  case 0x76b:
  case 0x76c:
  case 0x76d:
  case 0x76e:
  case 0x771:
  case 0x772:
  case 0x774:
  case 0x775:
  case 0x776:
  case 0x777:
  case 0x77d:
  case 0x77e:
  case 0x783:
  case 0x784:
  case 0x785:
  case 0x786:
  case 0x789:
  case 0x78a:
  case 0x78c:
  case 0x78d:
  case 0x78e:
  case 0x78f:
  case 0x791:
  case 0x792:
  case 0x794:
  case 0x795:
  case 0x797:
  case 0x798:
  case 0x79a:
  case 0x79b:
  case 0x7c0:
  case 0x7c1:
  case 0x7c3:
  case 0x7c4:
  case 0x7c6:
  case 0x7c7:
  case 0x7c9:
  case 0x7ca:
  case 0x7cc:
  case 0x7cd:
  case 1999:
  case 2000:
  case 0x7d5:
  case 0x7d6:
  case 0x7db:
  case 0x7dc:
  case 0x7e1:
  case 0x7e2:
    if (uVar2 == 0xf) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateImm0(local_10,0);
    break;
  default:
    break;
  case 0x809:
  case 0x80d:
  case 0x811:
  case 0x81d:
  case 0x822:
  case 0x827:
  case 0x859:
  case 0x85d:
  case 0x861:
  case 0x86d:
  case 0x872:
  case 0x877:
    DVar4 = DecodeGPRRegisterClass
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98
                       ,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar4 = DecodeAddrMode6Operand
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90);
  _Var1 = Check(local_2c,DVar4);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
  uVar3 = MCInst_getOpcode(local_10);
  Inst_00 = (MCInst *)(ulong)(uVar3 - 0x768);
  switch(Inst_00) {
  case (MCInst *)0x0:
  case (MCInst *)0x3:
  case (MCInst *)0x5:
  case (MCInst *)0x9:
  case (MCInst *)0xc:
  case (MCInst *)0xe:
  case (MCInst *)0x15:
  case (MCInst *)0x1b:
  case (MCInst *)0x1d:
  case (MCInst *)0x21:
  case (MCInst *)0x24:
  case (MCInst *)0x26:
  case (MCInst *)0x29:
  case (MCInst *)0x2c:
  case (MCInst *)0x2f:
  case (MCInst *)0x32:
  case (MCInst *)0x58:
  case (MCInst *)0x5b:
  case (MCInst *)0x5e:
  case (MCInst *)0x61:
  case (MCInst *)0x64:
  case (MCInst *)0x67:
  case (MCInst *)0x6d:
  case (MCInst *)0x73:
  case (MCInst *)0x79:
    break;
  default:
    if (uVar2 == 0xd) {
      MCOperand_CreateReg0(local_10,0);
    }
    else if (uVar2 != 0xf) {
      DVar4 = DecodeGPRRegisterClass
                        (Inst_00,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
      _Var1 = Check(local_2c,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  uVar3 = MCInst_getOpcode(local_10);
  if (0xb < uVar3 - 0x790) {
    if (uVar3 - 0x7bf < 9) {
      DVar4 = DecodeDPairSpacedRegisterClass
                        (Inst_00,uVar3,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      _Var1 = Check(local_2c,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_002961ef;
    }
    if (8 < uVar3 - 0x7c8) {
      DVar4 = DecodeDPRRegisterClass
                        (Inst_00,uVar3,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      _Var1 = Check(local_2c,DVar4);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_002961ef;
    }
  }
  DVar4 = DecodeDPairRegisterClass
                    (Inst_00,uVar3,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  _Var1 = Check(local_2c,DVar4);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
LAB_002961ef:
  uVar5 = MCInst_getOpcode(local_10);
  Address_00 = (ulong)(uVar5 - 0x806);
  switch(Address_00) {
  case 0:
  case 3:
  case 4:
  case 7:
  case 8:
  case 0xb:
  case 0x50:
  case 0x53:
  case 0x54:
  case 0x57:
  case 0x58:
  case 0x5b:
    DVar4 = DecodeDPRRegisterClass(Inst_00,uVar3,Address_00,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  default:
    break;
  case 0x15:
  case 0x17:
  case 0x1a:
  case 0x1c:
  case 0x1f:
  case 0x21:
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6c:
  case 0x6f:
  case 0x71:
    DVar4 = DecodeDPRRegisterClass(Inst_00,uVar3,Address_00,in_stack_ffffffffffffff90);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar5 = MCInst_getOpcode(local_10);
  Decoder_00 = (void *)(ulong)(uVar5 - 0x806);
  switch(Decoder_00) {
  case (void *)0x0:
  case (void *)0x3:
  case (void *)0x4:
  case (void *)0x7:
  case (void *)0x8:
  case (void *)0xb:
  case (void *)0x50:
  case (void *)0x53:
  case (void *)0x54:
  case (void *)0x57:
  case (void *)0x58:
  case (void *)0x5b:
    DVar4 = DecodeDPRRegisterClass(Inst_00,uVar3,Address_00,Decoder_00);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  default:
    break;
  case (void *)0x15:
  case (void *)0x17:
  case (void *)0x1a:
  case (void *)0x1c:
  case (void *)0x1f:
  case (void *)0x21:
  case (void *)0x65:
  case (void *)0x67:
  case (void *)0x6a:
  case (void *)0x6c:
  case (void *)0x6f:
  case (void *)0x71:
    DVar4 = DecodeDPRRegisterClass(Inst_00,uVar3,Address_00,Decoder_00);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar5 = MCInst_getOpcode(local_10);
  if ((((uVar5 == 0x856) || (uVar5 - 0x859 < 2)) || (uVar5 - 0x85d < 2)) || (uVar5 == 0x861)) {
    DVar4 = DecodeDPRRegisterClass(Inst_00,uVar3,Address_00,Decoder_00);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else if ((((uVar5 == 0x86b) || (uVar5 == 0x86d)) ||
           ((uVar5 == 0x870 || ((uVar5 == 0x872 || (uVar5 == 0x875)))))) || (uVar5 == 0x877)) {
    DVar4 = DecodeDPRRegisterClass(Inst_00,uVar3,Address_00,Decoder_00);
    _Var1 = Check(local_2c,DVar4);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  return local_2c[0];
}

Assistant:

static DecodeStatus DecodeVSTInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// Writeback Operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1d8wb_register:
		case ARM_VST1d16wb_register:
		case ARM_VST1d32wb_register:
		case ARM_VST1d64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_register:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Twb_register:
		case ARM_VST1d16Twb_register:
		case ARM_VST1d32Twb_register:
		case ARM_VST1d64Twb_register:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST1d8Qwb_register:
		case ARM_VST1d16Qwb_register:
		case ARM_VST1d32Qwb_register:
		case ARM_VST1d64Qwb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d8wb_register:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_register:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2q8wb_register:
		case ARM_VST2q16wb_register:
		case ARM_VST2q32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b8wb_register:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_register:
			if (Rm == 0xF)
				return MCDisassembler_Fail;
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			if (Rm == 0xD)
				MCOperand_CreateReg0(Inst, 0);
			else if (Rm != 0xF) {
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
					return MCDisassembler_Fail;
			}
			break;
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
			break;
	}


	// First input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1q16:
		case ARM_VST1q32:
		case ARM_VST1q64:
		case ARM_VST1q8:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST2d16:
		case ARM_VST2d32:
		case ARM_VST2d8:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d32wb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST2b16:
		case ARM_VST2b32:
		case ARM_VST2b8:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Third input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}